

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

void __thiscall soul::AST::Constant::Constant(Constant *this,Context *c,Value *v)

{
  bool condition;
  Value *v_local;
  Context *c_local;
  Constant *this_local;
  
  Expression::Expression(&this->super_Expression,Constant,c,value);
  (this->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__Constant_0063b6a0;
  soul::Value::Value(&this->value,v);
  condition = soul::Value::isValid(&this->value);
  checkAssertion(condition,"value.isValid()","Constant",0x695);
  return;
}

Assistant:

Constant (const Context& c, Value v)
            : Expression (ObjectType::Constant, c, ExpressionKind::value), value (std::move (v))
        {
            SOUL_ASSERT (value.isValid());
        }